

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fkScanChildren(Parse *pParse,SrcList *pSrc,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,
                   int regData,int nIncr)

{
  short iCol;
  sqlite3 *db;
  i16 iCol_00;
  int iVar1;
  Vdbe *p;
  Expr *pEVar2;
  sColMap *psVar3;
  Expr *pEVar4;
  Expr *pLeft;
  Expr *pRight;
  WhereInfo *pWInfo;
  int iVar5;
  Op *pOVar6;
  sColMap *psVar7;
  ulong uVar8;
  long lVar9;
  NameContext sNameContext;
  NameContext local_68;
  
  db = pParse->db;
  p = sqlite3GetVdbe(pParse);
  iVar1 = 0;
  if (nIncr < 0) {
    iVar1 = sqlite3VdbeAddOp3(p,0x2e,(uint)pFKey->isDeferred,0,0);
  }
  if (pFKey->nCol < 1) {
    pLeft = (Expr *)0x0;
  }
  else {
    lVar9 = 0;
    pLeft = (Expr *)0x0;
    psVar7 = (sColMap *)aiCol;
    do {
      if (pIdx == (Index *)0x0) {
        iCol_00 = -1;
      }
      else {
        iCol_00 = pIdx->aiColumn[lVar9];
      }
      pEVar2 = exprTableRegister(pParse,pTab,regData,iCol_00);
      psVar3 = psVar7;
      if (aiCol == (int *)0x0) {
        psVar3 = pFKey->aCol;
      }
      pEVar4 = sqlite3Expr(db,0x3b,pFKey->pFrom->aCol[(short)psVar3->iFrom].zName);
      pEVar2 = sqlite3PExpr(pParse,0x35,pEVar2,pEVar4);
      pLeft = sqlite3ExprAnd(db,pLeft,pEVar2);
      lVar9 = lVar9 + 1;
      psVar7 = (sColMap *)&psVar7->field_0x4;
    } while (lVar9 < pFKey->nCol);
  }
  if ((0 < nIncr) && (pFKey->pFrom == pTab)) {
    if ((pTab->tabFlags & 0x20) == 0) {
      local_68.pParse = (Parse *)0x0;
      local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
      pEVar4 = sqlite3ExprAlloc(pParse->db,0xa8,(Token *)&local_68,0);
      pEVar2 = (Expr *)0x0;
      if (pEVar4 != (Expr *)0x0) {
        pEVar4->iTable = regData;
        pEVar4->affinity = 'D';
        pEVar2 = pEVar4;
      }
      iVar5 = pSrc->a[0].iCursor;
      local_68.pParse = (Parse *)0x0;
      local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
      pEVar4 = sqlite3ExprAlloc(db,0xa2,(Token *)&local_68,0);
      if (pEVar4 != (Expr *)0x0) {
        (pEVar4->y).pTab = pTab;
        pEVar4->iTable = iVar5;
        pEVar4->iColumn = -1;
      }
      pEVar2 = sqlite3PExpr(pParse,0x34,pEVar2,pEVar4);
    }
    else {
      if (pIdx->nKeyCol == 0) {
        pEVar2 = (Expr *)0x0;
      }
      else {
        uVar8 = 0;
        pEVar2 = (Expr *)0x0;
        do {
          iCol = pIdx->aiColumn[uVar8];
          pEVar4 = exprTableRegister(pParse,pTab,regData,iCol);
          pRight = sqlite3Expr(db,0x3b,pTab->aCol[iCol].zName);
          pEVar4 = sqlite3PExpr(pParse,0x2d,pEVar4,pRight);
          pEVar2 = sqlite3ExprAnd(db,pEVar2,pEVar4);
          uVar8 = uVar8 + 1;
        } while (uVar8 < pIdx->nKeyCol);
      }
      pEVar2 = sqlite3PExpr(pParse,0x13,pEVar2,(Expr *)0x0);
    }
    pLeft = sqlite3ExprAnd(db,pLeft,pEVar2);
  }
  local_68.nRef = 0;
  local_68.nErr = 0;
  local_68.ncFlags = 0;
  local_68._42_6_ = 0;
  local_68.uNC.pEList = (ExprList *)0x0;
  local_68.pNext = (NameContext *)0x0;
  local_68.pWinSelect = (Select *)0x0;
  local_68.pParse = pParse;
  local_68.pSrcList = pSrc;
  sqlite3ResolveExprNames(&local_68,pLeft);
  if (pParse->nErr == 0) {
    pWInfo = sqlite3WhereBegin(pParse,pSrc,pLeft,(ExprList *)0x0,(ExprList *)0x0,0,0);
    sqlite3VdbeAddOp3(p,0x96,(uint)pFKey->isDeferred,nIncr,0);
    if (pWInfo != (WhereInfo *)0x0) {
      sqlite3WhereEnd(pWInfo);
    }
  }
  if (pLeft != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pLeft);
  }
  if (iVar1 != 0) {
    if (p->db->mallocFailed == '\0') {
      iVar5 = p->nOp + -1;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      pOVar6 = p->aOp + iVar5;
    }
    else {
      pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar6->p2 = p->nOp;
  }
  return;
}

Assistant:

static void fkScanChildren(
  Parse *pParse,                  /* Parse context */
  SrcList *pSrc,                  /* The child table to be scanned */
  Table *pTab,                    /* The parent table */
  Index *pIdx,                    /* Index on parent covering the foreign key */
  FKey *pFKey,                    /* The foreign key linking pSrc to pTab */
  int *aiCol,                     /* Map from pIdx cols to child table cols */
  int regData,                    /* Parent row data starts here */
  int nIncr                       /* Amount to increment deferred counter by */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  int i;                          /* Iterator variable */
  Expr *pWhere = 0;               /* WHERE clause to scan with */
  NameContext sNameContext;       /* Context used to resolve WHERE clause */
  WhereInfo *pWInfo;              /* Context used by sqlite3WhereXXX() */
  int iFkIfZero = 0;              /* Address of OP_FkIfZero */
  Vdbe *v = sqlite3GetVdbe(pParse);

  assert( pIdx==0 || pIdx->pTable==pTab );
  assert( pIdx==0 || pIdx->nKeyCol==pFKey->nCol );
  assert( pIdx!=0 || pFKey->nCol==1 );
  assert( pIdx!=0 || HasRowid(pTab) );

  if( nIncr<0 ){
    iFkIfZero = sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, 0);
    VdbeCoverage(v);
  }

  /* Create an Expr object representing an SQL expression like:
  **
  **   <parent-key1> = <child-key1> AND <parent-key2> = <child-key2> ...
  **
  ** The collation sequence used for the comparison should be that of
  ** the parent key columns. The affinity of the parent key column should
  ** be applied to each child key value before the comparison takes place.
  */
  for(i=0; i<pFKey->nCol; i++){
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    Expr *pEq;                    /* Expression (pLeft = pRight) */
    i16 iCol;                     /* Index of column in child table */ 
    const char *zCol;             /* Name of column in child table */

    iCol = pIdx ? pIdx->aiColumn[i] : -1;
    pLeft = exprTableRegister(pParse, pTab, regData, iCol);
    iCol = aiCol ? aiCol[i] : pFKey->aCol[0].iFrom;
    assert( iCol>=0 );
    zCol = pFKey->pFrom->aCol[iCol].zName;
    pRight = sqlite3Expr(db, TK_ID, zCol);
    pEq = sqlite3PExpr(pParse, TK_EQ, pLeft, pRight);
    pWhere = sqlite3ExprAnd(db, pWhere, pEq);
  }

  /* If the child table is the same as the parent table, then add terms
  ** to the WHERE clause that prevent this entry from being scanned.
  ** The added WHERE clause terms are like this:
  **
  **     $current_rowid!=rowid
  **     NOT( $current_a==a AND $current_b==b AND ... )
  **
  ** The first form is used for rowid tables.  The second form is used
  ** for WITHOUT ROWID tables. In the second form, the *parent* key is
  ** (a,b,...). Either the parent or primary key could be used to 
  ** uniquely identify the current row, but the parent key is more convenient
  ** as the required values have already been loaded into registers
  ** by the caller.
  */
  if( pTab==pFKey->pFrom && nIncr>0 ){
    Expr *pNe;                    /* Expression (pLeft != pRight) */
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    if( HasRowid(pTab) ){
      pLeft = exprTableRegister(pParse, pTab, regData, -1);
      pRight = exprTableColumn(db, pTab, pSrc->a[0].iCursor, -1);
      pNe = sqlite3PExpr(pParse, TK_NE, pLeft, pRight);
    }else{
      Expr *pEq, *pAll = 0;
      assert( pIdx!=0 );
      for(i=0; i<pIdx->nKeyCol; i++){
        i16 iCol = pIdx->aiColumn[i];
        assert( iCol>=0 );
        pLeft = exprTableRegister(pParse, pTab, regData, iCol);
        pRight = sqlite3Expr(db, TK_ID, pTab->aCol[iCol].zName);
        pEq = sqlite3PExpr(pParse, TK_IS, pLeft, pRight);
        pAll = sqlite3ExprAnd(db, pAll, pEq);
      }
      pNe = sqlite3PExpr(pParse, TK_NOT, pAll, 0);
    }
    pWhere = sqlite3ExprAnd(db, pWhere, pNe);
  }

  /* Resolve the references in the WHERE clause. */
  memset(&sNameContext, 0, sizeof(NameContext));
  sNameContext.pSrcList = pSrc;
  sNameContext.pParse = pParse;
  sqlite3ResolveExprNames(&sNameContext, pWhere);

  /* Create VDBE to loop through the entries in pSrc that match the WHERE
  ** clause. For each row found, increment either the deferred or immediate
  ** foreign key constraint counter. */
  if( pParse->nErr==0 ){
    pWInfo = sqlite3WhereBegin(pParse, pSrc, pWhere, 0, 0, 0, 0);
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
    if( pWInfo ){
      sqlite3WhereEnd(pWInfo);
    }
  }

  /* Clean up the WHERE clause constructed above. */
  sqlite3ExprDelete(db, pWhere);
  if( iFkIfZero ){
    sqlite3VdbeJumpHere(v, iFkIfZero);
  }
}